

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int g_write(lua_State *L,FILE *f,int arg)

{
  int iVar1;
  lua_State *plVar2;
  int iVar3;
  int in_EDX;
  FILE *in_RSI;
  lua_State *in_RDI;
  char *s;
  size_t l;
  int status;
  int nargs;
  bool local_41;
  FILE *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffcc;
  lua_State *in_stack_ffffffffffffffd0;
  lua_State *in_stack_ffffffffffffffd8;
  uint i;
  
  iVar1 = lua_gettop(in_RDI);
  i = 1;
  iVar1 = iVar1 + -1;
  while (iVar3 = iVar1 + -1, iVar1 != 0) {
    iVar1 = lua_type(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    if (iVar1 == 3) {
      in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc & 0xffffff;
      if (i != 0) {
        in_stack_ffffffffffffffc0 = in_RSI;
        lua_tonumber(in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
        iVar1 = fprintf(in_stack_ffffffffffffffc0,"%.14g");
        in_stack_ffffffffffffffcc = CONCAT13(0 < iVar1,(int3)in_stack_ffffffffffffffcc);
      }
      i = in_stack_ffffffffffffffcc >> 0x18;
    }
    else {
      in_stack_ffffffffffffffd0 =
           (lua_State *)
           luaL_checklstring(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                             (size_t *)in_stack_ffffffffffffffc0);
      local_41 = false;
      if (i != 0) {
        plVar2 = (lua_State *)
                 fwrite(in_stack_ffffffffffffffd0,1,(size_t)in_stack_ffffffffffffffd8,in_RSI);
        local_41 = plVar2 == in_stack_ffffffffffffffd8;
      }
      i = (uint)local_41;
    }
    in_EDX = in_EDX + 1;
    iVar1 = iVar3;
  }
  iVar1 = pushresult((lua_State *)CONCAT44(in_EDX,iVar3),i,(char *)in_stack_ffffffffffffffd8);
  return iVar1;
}

Assistant:

static int g_write(lua_State*L,FILE*f,int arg){
int nargs=lua_gettop(L)-1;
int status=1;
for(;nargs--;arg++){
if(lua_type(L,arg)==3){
status=status&&
fprintf(f,"%.14g",lua_tonumber(L,arg))>0;
}
else{
size_t l;
const char*s=luaL_checklstring(L,arg,&l);
status=status&&(fwrite(s,sizeof(char),l,f)==l);
}
}
return pushresult(L,status,NULL);
}